

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  long *plVar1;
  anon_class_8_1_8991fb9c *func;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar2;
  NullableValue<kj::Exception> _exception326;
  OwnTask self;
  ExceptionOr<kj::_::Void> result;
  kj local_4f0 [8];
  undefined1 local_4e8 [8];
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_4e0;
  NullableValue<kj::Exception> local_348;
  NullableValue<kj::Exception> local_1b0;
  undefined1 local_18;
  
  local_1b0.isSet = false;
  local_18 = 0;
  (**(code **)(**(long **)(in_RSI + 0x68) + 0x18))();
  runCatchingExceptions<kj::TaskSet::Task::fire()::_lambda()_1_>
            ((Maybe<kj::Exception> *)&local_348,local_4f0,func);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_4e8,&local_348);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_348);
  if (local_4e8[0] == true) {
    kj::_::ExceptionOrValue::addException((ExceptionOrValue *)&local_1b0,&aStack_4e0.value);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_4e8);
  pop((Task *)&local_348);
  plVar1 = *(long **)(*(long *)(in_RSI + 0x60) + 0x18);
  if ((plVar1 != (long *)0x0) && (*(long *)(*(long *)(in_RSI + 0x60) + 8) == 0)) {
    (**(code **)(*plVar1 + 0x10))(plVar1,local_4e8);
    local_4e8 = (undefined1  [8])0x0;
    aStack_4e0.value.ownFile.content.ptr = (char *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(*(long *)(in_RSI + 0x60) + 0x10),
               (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_4e8);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_4e8);
  }
  if (local_1b0.isSet == true) {
    (*(code *)**(undefined8 **)**(undefined8 **)(in_RSI + 0x60))
              ((undefined8 *)**(undefined8 **)(in_RSI + 0x60),&local_1b0.field_1);
  }
  Own<kj::_::Event,decltype(nullptr)>::Own<kj::TaskSet::Task,kj::_::PromiseDisposer,void>
            ((Own<kj::_::Event,decltype(nullptr)> *)local_4e8,
             (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&local_348);
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)local_4e8;
  (this->super_PromiseArenaMember).arena = (PromiseArena *)aStack_4e0.value.ownFile.content.ptr;
  aStack_4e0.value.ownFile.content.ptr = (char *)0x0;
  Own<kj::_::Event,_std::nullptr_t>::dispose((Own<kj::_::Event,_std::nullptr_t> *)local_4e8);
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *)&local_348);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1b0);
  MVar2.ptr.ptr = extraout_RDX;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(exception));
    }

    // Remove from the task list. Do this before calling taskFailed(), so that taskFailed() can
    // safely call clear().
    auto self = pop();

    // We'll also process onEmpty() now, just in case `taskFailed()` actually destroys the whole
    // `TaskSet`.
    KJ_IF_SOME(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == kj::none) {
        f->fulfill();
        taskSet.emptyFulfiller = kj::none;
      }
    }

    // Call the error handler if there was an exception.
    KJ_IF_SOME(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(e));
    }

    return Own<Event>(mv(self));
  }